

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O0

void mllr_dump(float32 ***A,float32 **B,float32 **H,int32 veclen,int32 nclass)

{
  char *__s;
  char *tmpstr;
  uint local_30;
  int32 k;
  int32 j;
  int32 i;
  int32 nclass_local;
  int32 veclen_local;
  float32 **H_local;
  float32 **B_local;
  float32 ***A_local;
  
  if (A == (float32 ***)0x0) {
    __assert_fail("A != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                  ,0x52,"void mllr_dump(float32 ***, float32 **, float32 **, int32, int32)");
  }
  if (B != (float32 **)0x0) {
    __s = (char *)__ckd_calloc__((long)(veclen * (veclen + 2) * 0x14),1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                 ,0x55);
    for (k = 0; k < nclass; k = k + 1) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
              ,0x58,"%d:\n",(ulong)(uint)k);
      for (local_30 = 0; (int)local_30 < veclen; local_30 = local_30 + 1) {
        sprintf(__s,"A %d ",(ulong)local_30);
        for (tmpstr._4_4_ = 0; tmpstr._4_4_ < veclen; tmpstr._4_4_ = tmpstr._4_4_ + 1) {
          sprintf(__s,"%s %f ",(double)(float)A[k][(int)local_30][tmpstr._4_4_],__s);
        }
        sprintf(__s,"%s\n",__s);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                ,0x5f,"%s\n",__s);
      }
      sprintf(__s,"B\n");
      for (local_30 = 0; (int)local_30 < veclen; local_30 = local_30 + 1) {
        sprintf(__s,"%s %f ",(double)(float)B[k][(int)local_30],__s);
      }
      sprintf(__s,"%s \n",__s);
      sprintf(__s,"H\n");
      for (local_30 = 0; (int)local_30 < veclen; local_30 = local_30 + 1) {
        sprintf(__s,"%s %f ",(double)(float)H[k][(int)local_30],__s);
      }
      sprintf(__s,"%s \n",__s);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
              ,0x6e,"%s\n",__s);
    }
    ckd_free(__s);
    return;
  }
  __assert_fail("B != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                ,0x53,"void mllr_dump(float32 ***, float32 **, float32 **, int32, int32)");
}

Assistant:

void
mllr_dump(float32 *** A, float32 ** B, float32 **H, 
	  int32 veclen, int32 nclass)
{
    int32 i, j, k;
    char *tmpstr;
    assert(A != NULL);
    assert(B != NULL);

    tmpstr = ckd_calloc((veclen * (veclen + 2) * 20), sizeof(char));

    for (i = 0; i < nclass; i++) {
        E_INFO("%d:\n", i);
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "A %d ", j);
            for (k = 0; k < veclen; k++) {
                sprintf(tmpstr, "%s %f ", tmpstr, A[i][j][k]);
            }
            sprintf(tmpstr, "%s\n", tmpstr);
            E_INFO("%s\n", tmpstr);
        }

        sprintf(tmpstr, "B\n");
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "%s %f ", tmpstr, B[i][j]);
        }
        sprintf(tmpstr, "%s \n", tmpstr);

        sprintf(tmpstr, "H\n");
        for (j = 0; j < veclen; j++) {
            sprintf(tmpstr, "%s %f ", tmpstr, H[i][j]);
        }
        sprintf(tmpstr, "%s \n", tmpstr);

        E_INFO("%s\n", tmpstr);
    }

    ckd_free(tmpstr);
}